

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zesDriverGet(uint32_t *pCount,zes_driver_handle_t *phDrivers)

{
  _ze_driver_handle_t **_params;
  byte bVar1;
  uint uVar2;
  int iVar3;
  ze_result_t zVar4;
  ze_result_t zVar5;
  long *plVar6;
  undefined8 *puVar7;
  object_t<_ze_driver_handle_t_*> *poVar8;
  long lVar9;
  uint uVar10;
  pthread_once_t *__once_control;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint32_t library_driver_handle_count;
  uint local_58;
  uint local_54;
  zes_driver_handle_t *local_50;
  long local_48;
  uint *local_40;
  dditable_t *local_38;
  uint uVar11;
  
  LOCK();
  bVar1 = *(byte *)(context + 0x165c);
  *(byte *)(context + 0x165c) = 1;
  UNLOCK();
  lVar12 = context;
  local_50 = phDrivers;
  if (((bVar1 & 1) == 0) && (*(char *)(context + 0x165d) == '\0')) {
    __once_control = (pthread_once_t *)(context + 0x1658);
    local_38 = (dditable_t *)&stack0xffffffffffffffa8;
    plVar6 = (long *)__tls_get_addr(&PTR_001f3c58);
    *plVar6 = (long)&stack0xffffffffffffffc8;
    puVar7 = (undefined8 *)__tls_get_addr(&PTR_001f3d80);
    *puVar7 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar3 = pthread_once(__once_control,__once_proxy);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    *plVar6 = 0;
    *puVar7 = 0;
    lVar12 = context;
    LOCK();
    *(undefined1 *)(context + 0x165c) = 0;
    UNLOCK();
  }
  lVar9 = **(long **)(lVar12 + 0x1610);
  lVar12 = (*(long **)(lVar12 + 0x1610))[1];
  if (lVar9 == lVar12) {
    bVar14 = false;
    zVar4 = ZE_RESULT_SUCCESS;
    uVar10 = 0;
  }
  else {
    zVar4 = ZE_RESULT_SUCCESS;
    uVar10 = 0;
    do {
      if (*(int *)(lVar9 + 0xc) == 0 && *(int *)(lVar9 + 8) == 0) {
        if ((*pCount != 0) && (*pCount == uVar10)) break;
        local_58 = 0;
        zVar4 = (**(code **)(lVar9 + 0x9f0))(&stack0xffffffffffffffa8,0);
        if (zVar4 == ZE_RESULT_SUCCESS) {
          uVar11 = uVar10;
          if ((local_50 != (zes_driver_handle_t *)0x0) && (uVar2 = *pCount, uVar2 != 0)) {
            if (uVar2 < local_58 + uVar10) {
              local_58 = uVar2 - uVar10;
            }
            zVar4 = (**(code **)(lVar9 + 0x9f0))(&stack0xffffffffffffffa8);
            if (zVar4 != ZE_RESULT_SUCCESS) break;
            *(undefined1 *)(lVar9 + 0xd60) = 1;
            if (local_58 != 0) {
              uVar13 = 0;
              local_54 = uVar10;
              local_48 = lVar12;
              local_40 = pCount;
              do {
                _params = local_50 + (uVar10 + (int)uVar13);
                local_38 = (dditable_t *)(lVar9 + 0x18);
                poVar8 = singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>::
                         getInstance<_ze_driver_handle_t*&,dditable_t*>
                                   ((singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>
                                     *)(context + 0x8a0),_params,&stack0xffffffffffffffc8);
                *_params = (_ze_driver_handle_t *)poVar8;
                uVar13 = uVar13 + 1;
                lVar12 = local_48;
                pCount = local_40;
                uVar11 = local_54;
              } while (uVar13 < local_58);
            }
          }
          uVar10 = uVar11 + local_58;
          zVar4 = ZE_RESULT_SUCCESS;
        }
        else if (zVar4 == ZE_RESULT_ERROR_UNINITIALIZED) {
          *(undefined4 *)(lVar9 + 8) = 0x78000001;
          zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
        }
      }
      lVar9 = lVar9 + 0xd98;
    } while (lVar9 != lVar12);
    bVar14 = uVar10 != 0;
    if ((zVar4 != ZE_RESULT_SUCCESS) && (uVar10 == 0)) goto LAB_001bc058;
  }
  *pCount = uVar10;
LAB_001bc058:
  zVar5 = ZE_RESULT_SUCCESS;
  if (!bVar14) {
    zVar5 = zVar4;
  }
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of sysman drivers available.
                                                        ///< if count is greater than the number of sysman drivers available, then
                                                        ///< the loader shall update the value with the correct number of sysman
                                                        ///< drivers available.
        zes_driver_handle_t* phDrivers                  ///< [in,out][optional][range(0, *pCount)] array of sysman driver instance handles.
                                                        ///< if count is less than the number of sysman drivers available, then the
                                                        ///< loader shall only retrieve that number of sysman drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        uint32_t total_driver_handle_count = 0;

        if (!loader::context->sortingInProgress.exchange(true) && !loader::context->instrumentationEnabled) {
            std::call_once(loader::context->sysmanDriverSortOnce, []() {
                loader::context->driverSorting(loader::context->sysmanInstanceDrivers, nullptr, true);
            });
            loader::context->sortingInProgress.store(false);
        }

        for( auto& drv : *loader::context->sysmanInstanceDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS || drv.initSysManStatus != ZE_RESULT_SUCCESS)
                continue;

            if( ( 0 < *pCount ) && ( *pCount == total_driver_handle_count))
                break;

            uint32_t library_driver_handle_count = 0;

            result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, nullptr );
            if( ZE_RESULT_SUCCESS != result ) {
                // If Get Drivers fails with Uninitialized, then update the driver init status to prevent reporting this driver in the next get call.
                if (ZE_RESULT_ERROR_UNINITIALIZED == result) {
                    drv.initStatus = result;
                }
                continue;
            }

            if( nullptr != phDrivers && *pCount !=0)
            {
                if( total_driver_handle_count + library_driver_handle_count > *pCount) {
                    library_driver_handle_count = *pCount - total_driver_handle_count;
                }
                result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, &phDrivers[ total_driver_handle_count ] );
                if( ZE_RESULT_SUCCESS != result ) break;

                drv.driverInuse = true;

                try
                {
                    for( uint32_t i = 0; i < library_driver_handle_count; ++i ) {
                        uint32_t driver_index = total_driver_handle_count + i;
                        phDrivers[ driver_index ] = reinterpret_cast<zes_driver_handle_t>(
                            context->zes_driver_factory.getInstance( phDrivers[ driver_index ], &drv.dditable ) );
                    }
                }
                catch( std::bad_alloc& )
                {
                    result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
                }
            }

            total_driver_handle_count += library_driver_handle_count;
        }

        // If the last driver get failed, but at least one driver succeeded, then return success with total count.
        if( ZE_RESULT_SUCCESS == result || total_driver_handle_count > 0)
            *pCount = total_driver_handle_count;
        if (total_driver_handle_count > 0) {
            result = ZE_RESULT_SUCCESS;
        }

        return result;
    }